

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

double getVariance(Mat *inputImg,int y,int x)

{
  double dVar1;
  _InputArray *p_Var2;
  int iVar3;
  int iVar4;
  Scalar stddev;
  Scalar mean;
  Mat tempMat;
  _OutputArray local_160;
  _OutputArray local_148;
  _InputArray local_130;
  double local_118;
  Mat *pMStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  _InputArray local_f8;
  undefined8 uStack_e0;
  Mat local_90 [96];
  
  iVar3 = y - (uint)(0 < y);
  if (y + 1 < *(int *)(inputImg + 8)) {
    y = y + 1;
  }
  iVar4 = x - (uint)(0 < x);
  if (x + 1 < *(int *)(inputImg + 0xc)) {
    x = x + 1;
  }
  cv::Mat::Mat(local_90);
  local_130.obj = (void *)CONCAT44((y - iVar3) + 1,(x - iVar4) + 1);
  local_130.flags = iVar4;
  local_130._4_4_ = iVar3;
  cv::Mat::Mat((Mat *)&local_f8,inputImg,(Rect_ *)&local_130);
  uStack_108 = 0;
  local_118 = (double)CONCAT44(local_118._4_4_,0x2010000);
  pMStack_110 = local_90;
  cv::Mat::copyTo((_OutputArray *)&local_f8);
  cv::Mat::~Mat((Mat *)&local_f8);
  local_f8.sz.width = 0;
  local_f8.sz.height = 0;
  uStack_e0 = 0;
  local_f8.flags = 0;
  local_f8._4_4_ = 0;
  local_f8.obj = (void *)0x0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_118 = 0.0;
  pMStack_110 = (Mat *)0x0;
  local_130.sz.width = 0;
  local_130.sz.height = 0;
  local_130.flags = 0x1010000;
  local_148.super__InputArray.flags = -0x3dfdfffa;
  local_148.super__InputArray.sz.width = 1;
  local_148.super__InputArray.sz.height = 4;
  local_160.super__InputArray.flags = -0x3dfdfffa;
  local_160.super__InputArray.sz.width = 1;
  local_160.super__InputArray.sz.height = 4;
  local_160.super__InputArray.obj = &local_118;
  local_148.super__InputArray.obj = &local_f8;
  local_130.obj = local_90;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_130,&local_148,&local_160,p_Var2);
  dVar1 = local_118 * local_118;
  cv::Mat::~Mat(local_90);
  return dVar1;
}

Assistant:

double getVariance(Mat &inputImg, int y , int x) {
    int lowerBoundY = y -1 >=  0? y -1 : y;
    int upperBoundY = y + 1 < inputImg.rows? y + 1 : y;
    int lowerBoundX = x - 1 >= 0? x -1  :  x;
    int upperBoundX = x + 1 < inputImg.cols? x + 1 : x;
    Mat tempMat;
    int length = (upperBoundY - lowerBoundY) + 1;
    int width = (upperBoundX - lowerBoundX) + 1;
    inputImg(Rect(lowerBoundX, lowerBoundY, width, length)).copyTo(tempMat);
    Scalar mean, stddev;
    meanStdDev(tempMat, mean, stddev);
    return stddev.val[0] * stddev.val[0];
}